

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O1

Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
llbuild::commands::util::readFileContents(StringRef filename)

{
  Child LHS;
  Child LHS_00;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  StringError *this;
  size_t sVar5;
  NodeKind NVar6;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  this_00;
  Child CVar8;
  Child CVar9;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EVar10;
  StringRef str;
  error_code EC;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  SmallString<256U> path;
  Child local_288 [2];
  undefined2 local_278;
  undefined6 uStack_276;
  Child local_268 [2];
  undefined2 local_258;
  undefined6 uStack_256;
  Child local_248 [2];
  undefined2 local_238;
  undefined6 uStack_236;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_230;
  byte local_220;
  Twine local_218;
  undefined4 local_200;
  undefined4 uStack_1fc;
  NodeKind local_1f0;
  char cStack_1ef;
  undefined6 uStack_1ee;
  uint local_1e8;
  undefined4 uStack_1e4;
  NodeKind local_1d8;
  char cStack_1d7;
  undefined6 uStack_1d6;
  uint local_1d0;
  undefined4 uStack_1cc;
  NodeKind local_1c0;
  char cStack_1bf;
  undefined6 uStack_1be;
  uint local_1b8;
  undefined4 uStack_1b4;
  NodeKind local_1a8;
  char cStack_1a7;
  undefined6 uStack_1a6;
  uint local_1a0;
  undefined4 uStack_19c;
  NodeKind local_190;
  char cStack_18f;
  undefined6 uStack_18e;
  Child local_188 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  Error local_168;
  string local_160;
  SmallVectorImpl<char> local_140;
  util local_130 [256];
  
  this_00 = (anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
             )filename.Data;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_140,(char *)filename.Length,(char *)filename.Length + in_RDX);
  llvm::sys::fs::make_absolute(&local_140);
  llvm::Twine::Twine((Twine *)local_188,&local_140);
  sVar5 = 1;
  llvm::MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_230.TStorage,(Twine *)local_188,-1,true,false);
  uVar7 = local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  if ((local_220 & 1) == 0) {
    *(byte *)((long)this_00 + 8) = *(byte *)((long)this_00 + 8) & 0xfe;
    *(AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
      *)this_00 = local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
    local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
    uVar7 = extraout_RDX;
  }
  else {
    llvm::Twine::Twine((Twine *)&local_1a0,"unable to read input \"");
    str.Data = (char *)(local_140.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                       0xffffffff);
    str.Length = sVar5;
    escapedString_abi_cxx11_
              ((string *)local_188,
               (util *)local_140.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,str)
    ;
    llvm::Twine::Twine((Twine *)&local_1b8,(string *)local_188);
    if ((local_190 == NullKind) || (local_1a8 == NullKind)) {
      local_278 = 0x100;
    }
    else if (local_190 == EmptyKind) {
      local_278._1_1_ = cStack_1a7;
      local_278._0_1_ = local_1a8;
      uStack_276 = uStack_1a6;
      local_288[0]._0_4_ = local_1b8;
      local_288[0]._4_4_ = uStack_1b4;
    }
    else if (local_1a8 == EmptyKind) {
      local_278._1_1_ = cStack_18f;
      local_278._0_1_ = local_190;
      uStack_276 = uStack_18e;
      local_288[0]._0_4_ = local_1a0;
      local_288[0]._4_4_ = uStack_19c;
    }
    else {
      CVar9._4_4_ = uStack_19c;
      CVar9.decUI = local_1a0;
      if (cStack_18f != '\x01') {
        local_190 = TwineKind;
        CVar9.twine = (Twine *)&local_1a0;
      }
      if (cStack_1a7 != '\x01') {
        local_1a8 = TwineKind;
      }
      CVar4._4_4_ = uStack_1b4;
      CVar4.decUI = local_1b8;
      CVar8.twine = (Twine *)&local_1b8;
      if (cStack_1a7 == '\x01') {
        CVar8 = CVar4;
      }
      llvm::Twine::Twine((Twine *)local_288,CVar9,local_190,CVar8,local_1a8);
    }
    llvm::Twine::Twine((Twine *)&local_1d0,"\" (");
    if (((NodeKind)local_278 == NullKind) || (local_1c0 == NullKind)) {
      local_258 = 0x100;
    }
    else if ((NodeKind)local_278 == EmptyKind) {
      local_258._1_1_ = cStack_1bf;
      local_258._0_1_ = local_1c0;
      uStack_256 = uStack_1be;
      local_268[0]._0_4_ = local_1d0;
      local_268[0]._4_4_ = uStack_1cc;
    }
    else if (local_1c0 == EmptyKind) {
      local_258._0_1_ = (NodeKind)local_278;
      local_258._1_1_ = local_278._1_1_;
      uStack_256 = uStack_276;
      local_268[0].decUI = local_288[0].decUI;
      local_268[0]._4_4_ = local_288[0]._4_4_;
    }
    else {
      CVar8._4_4_ = local_288[0]._4_4_;
      CVar8.decUI = local_288[0].decUI;
      NVar6 = (NodeKind)local_278;
      if (local_278._1_1_ != EmptyKind) {
        CVar8.twine = (Twine *)local_288;
        NVar6 = TwineKind;
      }
      if (cStack_1bf != '\x01') {
        local_1c0 = TwineKind;
      }
      CVar3._4_4_ = uStack_1cc;
      CVar3.decUI = local_1d0;
      CVar9.twine = (Twine *)&local_1d0;
      if (cStack_1bf == '\x01') {
        CVar9 = CVar3;
      }
      llvm::Twine::Twine((Twine *)local_268,CVar8,NVar6,CVar9,local_1c0);
    }
    (**(code **)(*(long *)local_230._8_8_ + 0x20))(&local_160,local_230._8_8_,uVar7 & 0xffffffff);
    llvm::Twine::Twine((Twine *)&local_1e8,&local_160);
    if (((NodeKind)local_258 == NullKind) || (local_1d8 == NullKind)) {
      local_238 = 0x100;
    }
    else if ((NodeKind)local_258 == EmptyKind) {
      local_238._1_1_ = cStack_1d7;
      local_238._0_1_ = local_1d8;
      uStack_236 = uStack_1d6;
      local_248[0]._0_4_ = local_1e8;
      local_248[0]._4_4_ = uStack_1e4;
    }
    else if (local_1d8 == EmptyKind) {
      local_238._0_1_ = (NodeKind)local_258;
      local_238._1_1_ = local_258._1_1_;
      uStack_236 = uStack_256;
      local_248[0].decUI = local_268[0].decUI;
      local_248[0]._4_4_ = local_268[0]._4_4_;
    }
    else {
      LHS._4_4_ = local_268[0]._4_4_;
      LHS.decUI = local_268[0].decUI;
      NVar6 = (NodeKind)local_258;
      if (local_258._1_1_ != EmptyKind) {
        LHS.twine = (Twine *)local_268;
        NVar6 = TwineKind;
      }
      if (cStack_1d7 != '\x01') {
        local_1d8 = TwineKind;
      }
      CVar2._4_4_ = uStack_1e4;
      CVar2.decUI = local_1e8;
      CVar9.twine = (Twine *)&local_1e8;
      if (cStack_1d7 == '\x01') {
        CVar9 = CVar2;
      }
      llvm::Twine::Twine((Twine *)local_248,LHS,NVar6,CVar9,local_1d8);
    }
    llvm::Twine::Twine((Twine *)&local_200,")");
    if (((NodeKind)local_238 == NullKind) || (local_1f0 == NullKind)) {
      local_218._16_2_ = 0x100;
    }
    else if ((NodeKind)local_238 == EmptyKind) {
      local_218.RHSKind = cStack_1ef;
      local_218.LHSKind = local_1f0;
      local_218._18_6_ = uStack_1ee;
    }
    else if (local_1f0 == EmptyKind) {
      local_218.LHSKind = (NodeKind)local_238;
      local_218.RHSKind = local_238._1_1_;
      local_218._18_6_ = uStack_236;
    }
    else {
      LHS_00._4_4_ = local_248[0]._4_4_;
      LHS_00.decUI = local_248[0].decUI;
      NVar6 = (NodeKind)local_238;
      if (local_238._1_1_ != EmptyKind) {
        LHS_00.twine = (Twine *)local_248;
        NVar6 = TwineKind;
      }
      if (cStack_1ef != '\x01') {
        local_1f0 = TwineKind;
      }
      CVar1._4_4_ = uStack_1fc;
      CVar1.decUI = local_200;
      CVar9.twine = (Twine *)&local_200;
      if (cStack_1ef == '\x01') {
        CVar9 = CVar1;
      }
      llvm::Twine::Twine(&local_218,LHS_00,NVar6,CVar9,local_1f0);
    }
    this = (StringError *)operator_new(0x38);
    EC._0_8_ = uVar7 & 0xffffffff;
    EC._M_cat = (error_category *)local_230._8_8_;
    llvm::StringError::StringError(this,&local_218,EC);
    local_168.Payload = (ErrorInfoBase *)((ulong)this | 1);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)this_00,&local_168);
    uVar7 = extraout_RDX_00;
    if ((long *)((ulong)local_168.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_168.Payload & 0xfffffffffffffffe) + 8))();
      uVar7 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      uVar7 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188[0].twine != &local_178) {
      operator_delete(local_188[0].twine,local_178._M_allocated_capacity + 1);
      uVar7 = extraout_RDX_03;
    }
  }
  if ((local_220 & 1) == 0) {
    if (local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
        (AlignedCharArray<8UL,_8UL>)0x0) {
      (**(code **)(*(long *)local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
      uVar7 = extraout_RDX_04;
    }
    local_230.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
  }
  if ((util *)local_140.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_130)
  {
    free(local_140.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    uVar7 = extraout_RDX_05;
  }
  EVar10._8_8_ = uVar7;
  EVar10.field_0 = this_00;
  return EVar10;
}

Assistant:

llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>> util::readFileContents(
    StringRef filename) {
  SmallString<256> path(filename);
  llvm::sys::fs::make_absolute(path);

  auto bufferOrError = llvm::MemoryBuffer::getFile(path);
  if (!bufferOrError) {
    auto ec = bufferOrError.getError();
    return llvm::make_error<llvm::StringError>(
        Twine("unable to read input \"") + util::escapedString(path) +
        "\" (" + ec.message() + ")", ec);
  }
  return std::move(*bufferOrError);
}